

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall
capnp::SchemaLoader::Validator::validate(Validator *this,Reader *structNode,uint64_t scopeId)

{
  void *pvVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char *pcVar4;
  ListElementCount LVar5;
  ListElementCount LVar6;
  int iVar7;
  uint uVar8;
  bool *pbVar9;
  unsigned_short *puVar10;
  ulong uVar11;
  Validator *pVVar12;
  ushort uVar13;
  uint uVar14;
  size_t elementCount;
  SegmentReader *pSVar15;
  uint uVar16;
  bool *ptrCopy_1;
  uint64_t id;
  bool *__s;
  bool *ptrCopy;
  bool *pbVar17;
  ElementCount index;
  ulong uVar18;
  bool bVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  bool fieldIsPointer;
  uint dataSizeInBits;
  uint nonDiscriminantPos;
  Reader *local_2b0;
  int local_2a8;
  uint nextOrdinal;
  uint discriminantPos;
  ushort local_29a;
  bool *local_298;
  uint pointerCount;
  Fault f;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  ushort *local_278;
  WirePointer *local_270;
  uint local_268;
  ushort local_264;
  int local_260;
  uint fieldBits;
  DebugComparison<unsigned_short,_int> _kjCondition;
  bool _kjCondition_3;
  undefined1 auStack_1d7 [15];
  WirePointer *local_1c8;
  int local_1c0;
  ushort *local_1a8;
  bool *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  size_t local_188;
  uint64_t scopeId_local;
  Fault f_3;
  undefined8 uStack_170;
  bool _kjCondition_7;
  uint7 uStack_147;
  Validator *local_140;
  WirePointer *local_138;
  int local_130;
  Array<bool> sawDiscriminantValue_heap;
  Array<bool> sawCodeOrder_heap;
  uint local_c0;
  anon_class_8_1_a7e8901a _kjContextFunc341;
  Reader fields;
  bool sawDiscriminantValue_stack [32];
  bool sawCodeOrder_stack [32];
  
  uVar8 = (structNode->_reader).dataSize;
  if (uVar8 < 0x80) {
    dataSizeInBits = 0;
    pointerCount = 0;
  }
  else {
    pvVar1 = (structNode->_reader).data;
    dataSizeInBits = (uint)*(ushort *)((long)pvVar1 + 0xe) << 6;
    pointerCount = 0;
    if (0xcf < uVar8) {
      pointerCount = (uint)*(ushort *)((long)pvVar1 + 0x18);
    }
  }
  bVar19 = 3 < (structNode->_reader).pointerCount;
  _kjCondition.op.content.size_ = (size_t)((structNode->_reader).pointers + 3);
  if (!bVar19) {
    _kjCondition.op.content.size_ = (size_t)(WirePointer *)0x0;
  }
  iVar7 = (structNode->_reader).nestingLimit;
  if (bVar19) {
    _kjCondition._0_4_ = *(undefined4 *)&(structNode->_reader).segment;
    _kjCondition.right = *(int *)((long)&(structNode->_reader).segment + 4);
    uVar20 = *(undefined4 *)&(structNode->_reader).capTable;
    uVar21 = *(undefined4 *)((long)&(structNode->_reader).capTable + 4);
  }
  else {
    _kjCondition._0_4_ = 0;
    _kjCondition.right = 0;
    uVar20 = 0;
    uVar21 = 0;
    iVar7 = 0x7fffffff;
  }
  _kjCondition.op.content.ptr = (char *)CONCAT44(uVar21,uVar20);
  _kjCondition._24_4_ = iVar7;
  local_2b0 = structNode;
  scopeId_local = scopeId;
  _::PointerReader::getList
            (&fields.reader,(PointerReader *)&_kjCondition,INLINE_COMPOSITE,(word *)0x0);
  LVar5 = fields.reader.elementCount;
  uVar11 = (ulong)fields.reader.elementCount;
  if (uVar11 < 0x21) {
    local_198 = (undefined8 *)0x0;
    pbVar9 = (bool *)0x0;
    __s = sawCodeOrder_stack;
    uVar18 = 0;
  }
  else {
    pbVar9 = (bool *)kj::_::HeapArrayDisposer::allocateImpl
                               (1,uVar11,uVar11,(_func_void_void_ptr *)0x0,
                                (_func_void_void_ptr *)0x0);
    local_198 = &kj::_::HeapArrayDisposer::instance;
    __s = pbVar9;
    uVar18 = uVar11;
  }
  memset(__s,0,uVar11);
  if ((local_2b0->_reader).dataSize < 0x100) {
    elementCount = 0;
LAB_0019dd2d:
    sawDiscriminantValue_heap.ptr = (bool *)0x0;
    sawDiscriminantValue_heap.size_ = 0;
    sawDiscriminantValue_heap.disposer = (ArrayDisposer *)0x0;
    local_1a0 = sawDiscriminantValue_stack;
    local_190 = (undefined8 *)0x0;
  }
  else {
    elementCount = (size_t)*(ushort *)((long)(local_2b0->_reader).data + 0x1e);
    if (elementCount < 0x21) goto LAB_0019dd2d;
    local_1a0 = (bool *)kj::_::HeapArrayDisposer::allocateImpl
                                  (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                                   (_func_void_void_ptr *)0x0);
    local_190 = &kj::_::HeapArrayDisposer::instance;
    sawDiscriminantValue_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    sawDiscriminantValue_heap.ptr = local_1a0;
    sawDiscriminantValue_heap.size_ = elementCount;
  }
  pbVar17 = sawDiscriminantValue_heap.ptr;
  local_188 = sawDiscriminantValue_heap.size_;
  memset(local_1a0,0,elementCount);
  uVar8 = (local_2b0->_reader).dataSize;
  if (0xff < uVar8) {
    pvVar1 = (local_2b0->_reader).data;
    uVar13 = *(ushort *)((long)pvVar1 + 0x1e);
    if (uVar13 != 0) {
      _kjCondition.left = uVar13;
      _kjCondition.right = 1;
      _kjCondition.op.content.ptr = " != ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = uVar13 != 1;
      if (uVar13 == 1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,int>&,char_const(&)[37]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x146,FAILED,"structNode.getDiscriminantCount() != 1",
                   "_kjCondition,\"union must have at least two members\"",&_kjCondition,
                   (char (*) [37])"union must have at least two members");
        this->isValid = false;
        kj::_::Debug::Fault::~Fault(&f);
        goto LAB_0019e7fa;
      }
      _kjCondition.right = fields.reader.elementCount;
      _kjCondition.op.content.ptr = " <= ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = fields.reader.elementCount >= uVar13;
      if (fields.reader.elementCount < uVar13) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_int>&,char_const(&)[54]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x148,FAILED,"structNode.getDiscriminantCount() <= fields.size()",
                   "_kjCondition,\"struct can\'t have more union fields than total fields\"",
                   (DebugComparison<unsigned_short,_unsigned_int> *)&_kjCondition,
                   (char (*) [54])"struct can\'t have more union fields than total fields");
        this->isValid = false;
        kj::_::Debug::Fault::~Fault(&f);
        goto LAB_0019e7fa;
      }
      _kjCondition._0_4_ = 0x10;
      if (0x11f < uVar8) {
        _kjCondition._0_4_ = *(int *)((long)pvVar1 + 0x20) * 0x10 + 0x10;
      }
      _kjCondition.op.content.ptr = (char *)&dataSizeInBits;
      _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_19a347;
      _kjCondition.result = true;
      _kjCondition._25_7_ = 0;
      if (dataSizeInBits < (uint)_kjCondition._0_4_) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int&>&,char_const(&)[36]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x14b,FAILED,"(structNode.getDiscriminantOffset() + 1) * 16 <= dataSizeInBits",
                   "_kjCondition,\"union discriminant is out-of-bounds\"",
                   (DebugComparison<unsigned_int,_unsigned_int_&> *)&_kjCondition,
                   (char (*) [36])"union discriminant is out-of-bounds");
        this->isValid = false;
        kj::_::Debug::Fault::~Fault(&f);
        goto LAB_0019e7fa;
      }
    }
  }
  uVar11 = (ulong)fields.reader.elementCount;
  uVar16 = 0;
  puVar10 = (unsigned_short *)kj::Arena::allocateBytes(&this->loader->arena,uVar11 * 2,2,false);
  LVar6 = fields.reader.elementCount;
  (this->membersByDiscriminant).ptr = puVar10;
  (this->membersByDiscriminant).size_ = uVar11;
  discriminantPos = 0;
  uVar8 = (local_2b0->_reader).dataSize;
  if (0xff < uVar8) {
    uVar16 = (uint)*(ushort *)((long)(local_2b0->_reader).data + 0x1e);
  }
  nextOrdinal = 0;
  nonDiscriminantPos = uVar16;
  if (fields.reader.elementCount != 0) {
    local_2a8 = 0;
    index = 0;
    local_298 = pbVar17;
    do {
      _::ListReader::getStructElement((StructReader *)&f,&fields.reader,index);
      kj::_::Debug::Context::Context((Context *)&_kjCondition);
      _kjCondition._0_8_ = &PTR__Context_0025f4d8;
      f_3.exception._0_4_ = 0;
      f_3.exception._4_4_ = 0;
      uStack_170._0_4_ = 0;
      uStack_170._4_4_ = 0;
      if (local_264 != 0) {
        f_3.exception._0_4_ = f.exception._0_4_;
        f_3.exception._4_4_ = f.exception._4_4_;
        uStack_170._0_4_ = uStack_280;
        uStack_170._4_4_ = uStack_27c;
      }
      __kjCondition_3 =
           (ArrayPtr<const_char>)
           _::PointerReader::getBlob<capnp::Text>((PointerReader *)&f_3,(void *)0x0,0);
      __kjCondition_7 = (SegmentReader *)&_kjCondition_3;
      _fieldBits = (anon_class_16_2_3f8e8a0c *)&_kjCondition_7;
      _f_3 = __kjCondition_3;
      local_140 = this;
      kj::
      Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
      ::
      upsert<kj::TreeMap<capnp::Text::Reader,unsigned_int>::upsert<capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_>(capnp::Text::Reader,unsigned_int,capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_&&)::_lambda(kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&,kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&&)_1_>
                ((Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
                  *)&this->members,(Entry *)&f_3,(anon_class_8_1_6f242a07 *)&fieldBits);
      if (local_268 < 0x10) {
        if (LVar5 == 0) {
LAB_0019e101:
          auVar2[0xf] = 0;
          auVar2._0_15_ = auStack_1d7;
          __kjCondition_3 = (ArrayPtr<const_char>)(auVar2 << 8);
          goto LAB_0019e109;
        }
        _kjCondition_3 = (bool)(*__s ^ 1);
        if (*__s != false) goto LAB_0019e109;
        uVar11 = 0;
LAB_0019e0d6:
        __s[uVar11] = true;
        if (local_268 < 0x60) {
          if (0x1f < local_268) goto LAB_0019e1c5;
LAB_0019e21b:
          uStack_170._0_4_ = fields.reader.elementCount;
          f_3.exception = (Exception *)&nonDiscriminantPos;
          if (fields.reader.elementCount < nonDiscriminantPos) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[39]>
                      ((Fault *)&_kjCondition_3,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                       ,0x16d,FAILED,"nonDiscriminantPos <= fields.size()",
                       "_kjCondition,\"discriminantCount did not match fields\"",
                       (DebugComparison<unsigned_int_&,_unsigned_int> *)&f_3,
                       (char (*) [39])"discriminantCount did not match fields");
            this->isValid = false;
            kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_3);
            goto LAB_0019e3da;
          }
          uVar14 = nonDiscriminantPos;
          nonDiscriminantPos = nonDiscriminantPos + 1;
LAB_0019e26c:
          (this->membersByDiscriminant).ptr[uVar14] = (unsigned_short)local_2a8;
          if (0x4f < local_268) {
            if (local_278[4] == 1) {
              if (local_268 < 0xc0) {
                id = 0;
              }
              else {
                id = *(uint64_t *)(local_278 + 8);
              }
              validateTypeId(this,id,STRUCT);
            }
            else if (local_278[4] == 0) goto LAB_0019e298;
LAB_0019e58f:
            local_2a8 = local_2a8 + 1;
            bVar19 = true;
            pbVar17 = local_298;
            goto LAB_0019e59b;
          }
LAB_0019e298:
          pSVar15 = (SegmentReader *)CONCAT44(f.exception._4_4_,f.exception._0_4_);
          pVVar12 = (Validator *)CONCAT44(uStack_27c,uStack_280);
          local_1a8 = local_278;
          _fieldBits = _fieldBits & 0xffffffff00000000;
          fieldIsPointer = false;
          local_29a = local_264;
          if (local_264 < 3) {
            local_1c0 = 0x7fffffff;
            auStack_1d7._7_8_ = (Validator *)0x0;
            local_1c8 = (WirePointer *)0x0;
            __kjCondition_3 = (SegmentReader *)0x0;
          }
          else {
            local_1c8 = local_270 + 2;
            auStack_1d7._7_8_ = pVVar12;
            __kjCondition_3 = pSVar15;
            local_1c0 = local_260;
          }
          _::PointerReader::getStruct
                    ((StructReader *)&f_3,(PointerReader *)&_kjCondition_3,(word *)0x0);
          if (local_29a < 4) {
            local_130 = 0x7fffffff;
            pVVar12 = (Validator *)0x0;
            local_138 = (WirePointer *)0x0;
            pSVar15 = (SegmentReader *)0x0;
          }
          else {
            local_138 = local_270 + 3;
            local_130 = local_260;
          }
          __kjCondition_7 = pSVar15;
          local_140 = pVVar12;
          _::PointerReader::getStruct
                    ((StructReader *)&_kjCondition_3,(PointerReader *)&_kjCondition_7,(word *)0x0);
          validate(this,(Reader *)&f_3,(Reader *)&_kjCondition_3,&fieldBits,&fieldIsPointer);
          if (local_268 < 0x40) {
            iVar7 = 1;
            uVar14 = fieldBits;
          }
          else {
            iVar7 = *(int *)(local_1a8 + 2) + 1;
            uVar14 = fieldBits * iVar7;
          }
          if (dataSizeInBits < uVar14) {
            __kjCondition_7 = (SegmentReader *)((ulong)uStack_147 << 8);
          }
          else {
            __kjCondition_7 =
                 (SegmentReader *)CONCAT71(uStack_147,(uint)fieldIsPointer * iVar7 <= pointerCount);
            if ((uint)fieldIsPointer * iVar7 <= pointerCount) goto LAB_0019e58f;
          }
          uVar20 = 0;
          if (0x3f < local_268) {
            uVar20 = *(undefined4 *)(local_1a8 + 2);
          }
          __kjCondition_3 = uVar20;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,bool&,char_const(&)[27],unsigned_int,unsigned_int&,unsigned_int&>
                    (&f_3,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x17b,FAILED,
                     "fieldBits * (slot.getOffset() + 1) <= dataSizeInBits && fieldIsPointer * (slot.getOffset() + 1) <= pointerCount"
                     ,
                     "_kjCondition,\"field offset out-of-bounds\", slot.getOffset(), dataSizeInBits, pointerCount"
                     ,&_kjCondition_7,(char (*) [27])"field offset out-of-bounds",
                     (uint *)&_kjCondition_3,&dataSizeInBits,&pointerCount);
          pbVar17 = local_298;
          this->isValid = false;
          kj::_::Debug::Fault::~Fault(&f_3);
          goto LAB_0019e14f;
        }
        if (local_278[5] == 1) {
          if (local_268 < 0x70) {
            uVar13 = 0;
          }
          else {
            uVar13 = local_278[6];
          }
          f_3.exception._0_2_ = uVar13;
          uStack_170 = (size_t)&nextOrdinal;
          if (nextOrdinal <= uVar13) {
            nextOrdinal = 1;
            if (0x6f < local_268) {
              nextOrdinal = local_278[6] + 1;
            }
            goto LAB_0019e1c5;
          }
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_int&>&,char_const(&)[35]>
                    ((Fault *)&_kjCondition_3,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x160,FAILED,"ordinal.getExplicit() >= nextOrdinal",
                     "_kjCondition,\"fields were not ordered by ordinal\"",
                     (DebugComparison<unsigned_short,_unsigned_int_&> *)&f_3,
                     (char (*) [35])"fields were not ordered by ordinal");
          this->isValid = false;
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_3);
        }
        else {
LAB_0019e1c5:
          if (local_278[1] == 0) goto LAB_0019e21b;
          uVar13 = ~local_278[1];
          local_c0 = (uint)elementCount;
          if (uVar13 < local_c0) {
            _kjCondition_3 = (bool)(local_1a0[uVar13] ^ 1);
            if (local_1a0[uVar13] != true) {
              local_1a0[uVar13] = true;
              uVar14 = discriminantPos;
              discriminantPos = discriminantPos + 1;
              goto LAB_0019e26c;
            }
          }
          else {
            auVar3[0xf] = 0;
            auVar3._0_15_ = auStack_1d7;
            __kjCondition_3 = (ArrayPtr<const_char>)(auVar3 << 8);
          }
          kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[26]>
                    (&f_3,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x167,FAILED,
                     "field.getDiscriminantValue() < sawDiscriminantValue.size() && !sawDiscriminantValue[field.getDiscriminantValue()]"
                     ,"_kjCondition,\"invalid discriminantValue\"",&_kjCondition_3,
                     (char (*) [26])"invalid discriminantValue");
          this->isValid = false;
          kj::_::Debug::Fault::~Fault(&f_3);
        }
LAB_0019e3da:
        bVar19 = false;
        pbVar17 = local_298;
      }
      else {
        if (LVar5 <= *local_278) goto LAB_0019e101;
        _kjCondition_3 = (bool)(__s[*local_278] ^ 1);
        if (__s[*local_278] == false) {
          uVar11 = (ulong)*local_278;
          goto LAB_0019e0d6;
        }
LAB_0019e109:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[18]>
                  (&f_3,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x15a,FAILED,
                   "field.getCodeOrder() < sawCodeOrder.size() && !sawCodeOrder[field.getCodeOrder()]"
                   ,"_kjCondition,\"invalid codeOrder\"",&_kjCondition_3,
                   (char (*) [18])"invalid codeOrder");
        this->isValid = false;
        kj::_::Debug::Fault::~Fault(&f_3);
LAB_0019e14f:
        bVar19 = false;
      }
LAB_0019e59b:
      kj::_::Debug::Context::~Context((Context *)&_kjCondition);
      if (!bVar19) goto LAB_0019e7fa;
      index = index + 1;
    } while (LVar6 != index);
    uVar8 = (local_2b0->_reader).dataSize;
  }
  pcVar4 = _kjCondition.op.content.ptr;
  if (uVar8 < 0x100) {
    uVar13 = 0;
  }
  else {
    uVar13 = *(ushort *)((long)(local_2b0->_reader).data + 0x1e);
  }
  _kjCondition._0_8_ = &discriminantPos;
  _kjCondition.op.content.ptr = (char *)CONCAT62(_kjCondition.op.content.ptr._2_6_,uVar13);
  _kjCondition.op.content.size_ = (long)"() {\n  return which() == " + 0x15;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  if (discriminantPos != uVar13) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_short>&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x18a,FAILED,"discriminantPos == structNode.getDiscriminantCount()","_kjCondition,",
               (DebugComparison<unsigned_int_&,_unsigned_short> *)&_kjCondition);
    kj::_::Debug::Fault::fatal(&f);
  }
  _kjCondition._0_8_ = &nonDiscriminantPos;
  _kjCondition.op.content.ptr._4_4_ = SUB84(pcVar4,4);
  _kjCondition.op.content.ptr =
       (char *)CONCAT44(_kjCondition.op.content.ptr._4_4_,fields.reader.elementCount);
  _kjCondition.op.content.size_ = (long)"() {\n  return which() == " + 0x15;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  if (nonDiscriminantPos != fields.reader.elementCount) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x18b,FAILED,"nonDiscriminantPos == fields.size()","_kjCondition,",
               (DebugComparison<unsigned_int_&,_unsigned_int> *)&_kjCondition);
    kj::_::Debug::Fault::fatal(&f);
  }
  if ((0xe0 < uVar8) &&
     (pvVar1 = (local_2b0->_reader).data, (*(byte *)((long)pvVar1 + 0x1c) & 1) != 0)) {
    _kjCondition._0_8_ = &scopeId_local;
    _kjCondition.op.content.ptr = (char *)((ulong)_kjCondition.op.content.ptr._4_4_ << 0x20);
    _kjCondition.op.content.size_ = (long)"  if (which() != " + 0xd;
    _kjCondition.result = true;
    _kjCondition._25_7_ = 0;
    if (scopeId == 0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[27]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x18e,FAILED,"scopeId != 0","_kjCondition,\"group node missing scopeId\"",
                 (DebugComparison<unsigned_long_&,_int> *)&_kjCondition,
                 (char (*) [27])"group node missing scopeId");
      this->isValid = false;
      kj::_::Debug::Fault::~Fault(&f);
    }
    else {
      Impl::requireStructSize
                (this->loader,scopeId,(uint)*(ushort *)((long)pvVar1 + 0xe),
                 (uint)*(ushort *)((long)pvVar1 + 0x18));
      validateTypeId(this,scopeId_local,STRUCT);
    }
  }
LAB_0019e7fa:
  if (pbVar17 != (bool *)0x0) {
    sawDiscriminantValue_heap.ptr = (bool *)0x0;
    sawDiscriminantValue_heap.size_ = 0;
    (**(code **)*local_190)(local_190,pbVar17,1,local_188,local_188,0);
  }
  if (pbVar9 != (bool *)0x0) {
    (**(code **)*local_198)(local_198,pbVar9,1,uVar18,uVar18,0);
  }
  return;
}

Assistant:

void validate(const schema::Node::Struct::Reader& structNode, uint64_t scopeId) {
    uint dataSizeInBits = structNode.getDataWordCount() * 64;
    uint pointerCount = structNode.getPointerCount();

    auto fields = structNode.getFields();

    KJ_STACK_ARRAY(bool, sawCodeOrder, fields.size(), 32, 256);
    memset(sawCodeOrder.begin(), 0, sawCodeOrder.size() * sizeof(sawCodeOrder[0]));

    KJ_STACK_ARRAY(bool, sawDiscriminantValue, structNode.getDiscriminantCount(), 32, 256);
    memset(sawDiscriminantValue.begin(), 0,
           sawDiscriminantValue.size() * sizeof(sawDiscriminantValue[0]));

    if (structNode.getDiscriminantCount() > 0) {
      VALIDATE_SCHEMA(structNode.getDiscriminantCount() != 1,
                      "union must have at least two members");
      VALIDATE_SCHEMA(structNode.getDiscriminantCount() <= fields.size(),
                      "struct can't have more union fields than total fields");

      VALIDATE_SCHEMA((structNode.getDiscriminantOffset() + 1) * 16 <= dataSizeInBits,
                      "union discriminant is out-of-bounds");
    }